

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_fexupl_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *status_00;
  fpr_t *pfVar2;
  uint uVar3;
  float32 fVar4;
  float64 fVar5;
  undefined4 in_register_00000014;
  float_status *pfVar6;
  float_status *extraout_RDX;
  float_status *extraout_RDX_00;
  long lVar7;
  float_status *status;
  uintptr_t unaff_retaddr;
  wr_t wx;
  float64 local_48 [3];
  
  pfVar6 = (float_status *)CONCAT44(in_register_00000014,wd);
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    status_00 = &(env->active_tc).msa_fp_status;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar4 = float32_from_float16
                        (*(int16_t *)
                          ((long)(env->active_fpu).fpr + lVar7 * 2 + (ulong)ws * 0x10 + 8),
                         (flag)status_00,pfVar6);
      *(float32 *)((long)local_48 + lVar7 * 4) = fVar4;
      uVar3 = update_msacsr(env,0,(uint)((fVar4 & 0x7f800000) == 0 && (fVar4 & 0x7fffffff) != 0));
      pfVar6 = extraout_RDX;
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar3) != 0) {
        fVar4 = float32_default_nan_mips64(status_00);
        *(float32 *)((long)local_48 + lVar7 * 4) = fVar4 & 0xffffffc0 ^ 0x400000 | uVar3;
        pfVar6 = extraout_RDX_00;
      }
    }
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c20,
                    "void helper_msa_fexupl_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar6 = &(env->active_tc).msa_fp_status;
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar5 = float64_from_float32
                        (*(int32_t *)
                          ((long)(env->active_fpu).fpr + lVar7 * 4 + (ulong)ws * 0x10 + 8),pfVar6);
      local_48[lVar7] = fVar5;
      uVar3 = update_msacsr(env,0,(uint)((fVar5 & 0x7ff0000000000000) == 0 &&
                                        (fVar5 & 0x7fffffffffffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar3) != 0) {
        fVar5 = float64_default_nan_mips64(pfVar6);
        local_48[lVar7] = (long)(int)uVar3 | fVar5 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
    }
  }
  check_msacsr_cause(env,unaff_retaddr);
  pfVar2 = (env->active_fpu).fpr + wd;
  pfVar2->fd = local_48[0];
  (&pfVar2->fd)[1] = local_48[1];
  return;
}

Assistant:

void helper_msa_fexupl_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                          uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            /*
             * Half precision floats come in two formats: standard
             * IEEE and "ARM" format.  The latter gains extra exponent
             * range by omitting the NaN/Inf encodings.
             */
            flag ieee = 1;

            MSA_FLOAT_BINOP(pwx->w[i], from_float16, Lh(pws, i), ieee, 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_float32, Lw(pws, i), 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());
    msa_move_v(pwd, pwx);
}